

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
EqualNode::Evaluate(string *__return_storage_ptr__,EqualNode *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *parameters,cmGeneratorExpressionContext *context,
                   GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  char *pEnd;
  string local_b8;
  cmGeneratorExpressionContext *local_98;
  GeneratorExpressionContent *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  long local_48;
  int *local_40;
  char *local_38;
  
  pcVar10 = (((parameters->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_98 = context;
  local_90 = content;
  iVar2 = strncmp(pcVar10,"0b",2);
  if (iVar2 == 0) {
LAB_0036ea45:
    pcVar10 = pcVar10 + 2;
    iVar9 = 2;
  }
  else {
    iVar2 = strncmp(pcVar10,"0B",2);
    iVar9 = 0;
    if (iVar2 == 0) goto LAB_0036ea45;
  }
  iVar2 = strncmp(pcVar10,"-0b",3);
  if ((iVar2 == 0) || (iVar2 = strncmp(pcVar10,"-0B",3), iVar2 == 0)) {
    pcVar10 = pcVar10 + 3;
    bVar1 = true;
    iVar9 = 2;
  }
  else {
    bVar1 = false;
  }
  iVar2 = strncmp(pcVar10,"+0b",3);
  if ((iVar2 == 0) || (iVar2 = strncmp(pcVar10,"+0B",3), iVar2 == 0)) {
    pcVar10 = pcVar10 + 3;
    iVar9 = 2;
  }
  lVar3 = strtol(pcVar10,&local_38,iVar9);
  if (((local_38 == pcVar10) || (*local_38 != '\0')) ||
     (piVar4 = __errno_location(), *piVar4 == 0x22)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,local_90);
    std::operator+(&local_88,"$<EQUAL> parameter ",
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    reportError(local_98,&local_68,&local_b8);
    goto LAB_0036eb85;
  }
  local_48 = -lVar3;
  if (!bVar1) {
    local_48 = lVar3;
  }
  pcVar10 = (parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  local_40 = piVar4;
  iVar2 = strncmp(pcVar10,"0b",2);
  if (iVar2 == 0) {
LAB_0036ec4a:
    pcVar10 = pcVar10 + 2;
    iVar9 = 2;
  }
  else {
    iVar2 = strncmp(pcVar10,"0B",2);
    iVar9 = 0;
    if (iVar2 == 0) goto LAB_0036ec4a;
  }
  iVar2 = strncmp(pcVar10,"-0b",3);
  if ((iVar2 == 0) || (iVar2 = strncmp(pcVar10,"-0B",3), iVar2 == 0)) {
    pcVar10 = pcVar10 + 3;
    bVar1 = true;
    iVar9 = 2;
  }
  else {
    bVar1 = false;
  }
  iVar2 = strncmp(pcVar10,"+0b",3);
  if ((iVar2 == 0) || (iVar2 = strncmp(pcVar10,"+0B",3), iVar2 == 0)) {
    pcVar10 = pcVar10 + 3;
    iVar9 = 2;
  }
  lVar3 = strtol(pcVar10,&local_38,iVar9);
  if (((local_38 != pcVar10) && (*local_38 == '\0')) && (*local_40 != 0x22)) {
    lVar7 = -lVar3;
    if (!bVar1) {
      lVar7 = lVar3;
    }
    pcVar10 = "0";
    if (local_48 == lVar7) {
      pcVar10 = "1";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    if (local_48 == lVar7) {
      pcVar8 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar8)
    ;
    return __return_storage_ptr__;
  }
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,local_90);
  std::operator+(&local_88,"$<EQUAL> parameter ",
                 (parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar6;
    local_b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  reportError(local_98,&local_68,&local_b8);
LAB_0036eb85:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    char* pEnd;

    int base = 0;
    bool flipSign = false;

    const char* lhs = parameters[0].c_str();
    if (cmHasLiteralPrefix(lhs, "0b") || cmHasLiteralPrefix(lhs, "0B")) {
      base = 2;
      lhs += 2;
    }
    if (cmHasLiteralPrefix(lhs, "-0b") || cmHasLiteralPrefix(lhs, "-0B")) {
      base = 2;
      lhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(lhs, "+0b") || cmHasLiteralPrefix(lhs, "+0B")) {
      base = 2;
      lhs += 3;
    }

    long lnum = strtol(lhs, &pEnd, base);
    if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[0] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      lnum = -lnum;
    }

    base = 0;
    flipSign = false;

    const char* rhs = parameters[1].c_str();
    if (cmHasLiteralPrefix(rhs, "0b") || cmHasLiteralPrefix(rhs, "0B")) {
      base = 2;
      rhs += 2;
    }
    if (cmHasLiteralPrefix(rhs, "-0b") || cmHasLiteralPrefix(rhs, "-0B")) {
      base = 2;
      rhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(rhs, "+0b") || cmHasLiteralPrefix(rhs, "+0B")) {
      base = 2;
      rhs += 3;
    }

    long rnum = strtol(rhs, &pEnd, base);
    if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[1] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      rnum = -rnum;
    }

    return lnum == rnum ? "1" : "0";
  }